

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::ForkBranchBase::~ForkBranchBase(ForkBranchBase *this)

{
  uint *puVar1;
  ForkHubBase *node;
  ForkBranchBase ***pppFVar2;
  long in_FS_OFFSET;
  
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0038af40;
  if (this->prevPtr != (ForkBranchBase **)0x0) {
    *this->prevPtr = this->next;
    pppFVar2 = &this->next->prevPtr;
    if (this->next == (ForkBranchBase *)0x0) {
      pppFVar2 = &((this->hub).ptr)->tailBranch;
    }
    *pppFVar2 = this->prevPtr;
  }
  node = (this->hub).ptr;
  if (node != (ForkHubBase *)0x0) {
    (this->hub).ptr = (ForkHubBase *)0x0;
    puVar1 = &node->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      PromiseDisposer::dispose(&node->super_PromiseArenaMember);
    }
  }
  if (*(long *)(in_FS_OFFSET + -0x28) == 0) {
    return;
  }
  AsyncObject::failed();
}

Assistant:

ForkBranchBase::~ForkBranchBase() noexcept(false) {
  if (prevPtr != nullptr) {
    // Remove from hub's linked list of branches.
    *prevPtr = next;
    (next == nullptr ? hub->tailBranch : next->prevPtr) = prevPtr;
  }
}